

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_bit_count_instruction
               (GroupOperation operation,Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Operation *this_00;
  Value *value;
  Operation *this_01;
  Operation *op;
  Id bool_value;
  Operation *ballot_op;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  GroupOperation operation_local;
  
  this = Converter::Impl::builder(impl);
  IVar2 = spv::Builder::makeUintType(this,0x20);
  IVar2 = spv::Builder::makeVectorType(this,IVar2,4);
  this_00 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(this_00,IVar2);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  op._4_4_ = Converter::Impl::get_id_for_value(impl,value,0);
  bVar1 = wave_op_needs_helper_lane_masking(impl);
  if (bVar1) {
    op._4_4_ = build_masked_ballot(impl,op._4_4_);
  }
  Operation::add_id(this_00,op._4_4_);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpGroupNonUniformBallotBitCount,(Value *)instruction);
  IVar2 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(this_01,IVar2);
  Operation::add_literal(this_01,operation);
  Operation::add_id(this_01,this_00->id);
  spv::Builder::addCapability(this,CapabilityGroupNonUniformBallot);
  Converter::Impl::add(impl,this_01,false);
  return true;
}

Assistant:

bool emit_wave_bit_count_instruction(spv::GroupOperation operation, Converter::Impl &impl,
                                     const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	auto *ballot_op = impl.allocate(spv::OpGroupNonUniformBallot, builder.makeVectorType(builder.makeUintType(32), 4));
	ballot_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));

	spv::Id bool_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		bool_value = build_masked_ballot(impl, bool_value);
	ballot_op->add_id(bool_value);

	impl.add(ballot_op);

	auto *op = impl.allocate(spv::OpGroupNonUniformBallotBitCount, instruction);
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_literal(operation);
	op->add_id(ballot_op->id);

	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	impl.add(op);
	return true;
}